

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O0

void __thiscall DummyTest_Copy_Test::TestBody(DummyTest_Copy_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference file;
  reference expr1;
  reference expr2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>,_Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>_>
  p;
  Deque<int,_std::allocator<int>_> d2;
  int i;
  Deque<int,_std::allocator<int>_> d;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffdb8;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  int iVar3;
  char *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  Type type;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 uVar4;
  value_type *in_stack_fffffffffffffdf8;
  Deque<int,_std::allocator<int>_> *this_00;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *in_stack_fffffffffffffe08;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe10;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  uint uVar5;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  Message *in_stack_fffffffffffffe38;
  AssertHelper *in_stack_fffffffffffffe40;
  AssertionResult local_1b0 [15];
  int local_b8;
  Deque<int,_std::allocator<int>_> local_a1;
  
  this_00 = &local_a1;
  std::allocator<int>::allocator((allocator<int> *)0x16e801);
  Deque<int,_std::allocator<int>_>::Deque
            (in_stack_fffffffffffffe10,(allocator<int> *)in_stack_fffffffffffffe08);
  std::allocator<int>::~allocator((allocator<int> *)0x16e822);
  for (local_b8 = 0; type = (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20), local_b8 < 100;
      local_b8 = local_b8 + 1) {
    Deque<int,_std::allocator<int>_>::push_back(this_00,in_stack_fffffffffffffdf8);
  }
  Deque<int,_std::allocator<int>_>::Deque
            (in_stack_fffffffffffffe30,
             (Deque<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Deque<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffdb8);
  Deque<int,_std::allocator<int>_>::end
            ((Deque<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  Deque<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffdb8);
  std::
  mismatch<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            (in_stack_fffffffffffffe18,
             (DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Deque<int,_std::allocator<int>_>::end
            ((Deque<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  testing::internal::EqHelper<false>::
  Compare<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffdc0);
  iVar3 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
  uVar4 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffdf0));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x16e9e3);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffdf0),type,
               in_stack_fffffffffffffde0,iVar3,in_stack_fffffffffffffdd0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
    testing::Message::~Message((Message *)0x16ea37);
  }
  uVar5 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16ea9c);
  if (uVar5 == 0) {
    file = Deque<int,_std::allocator<int>_>::operator[]
                     (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    *file = 5;
    expr1 = Deque<int,_std::allocator<int>_>::operator[]
                      (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    expr2 = Deque<int,_std::allocator<int>_>::operator[]
                      (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    testing::internal::CmpHelperNE<int,int>
              ((char *)expr1,(char *)expr2,
               (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               (int *)in_stack_fffffffffffffdc0);
    iVar3 = (int)((ulong)expr1 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe18);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffdf0));
      in_stack_fffffffffffffdc0 =
           (Deque<int,_std::allocator<int>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x16eb84);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffdf0),type,(char *)file,iVar3,
                 (char *)expr2);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      testing::Message::~Message((Message *)0x16ebd2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16ec2e);
  }
  Deque<int,_std::allocator<int>_>::~Deque(in_stack_fffffffffffffdc0);
  Deque<int,_std::allocator<int>_>::~Deque(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

TEST(DummyTest, Copy) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
    }

    Deque<int> d2(d);
    auto p = std::mismatch(d.begin(), d.end(), d2.begin());
    ASSERT_EQ(p.first, d.end());

    d[3] = 5;
    ASSERT_NE(d[3], d2[3]);
}